

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

uchar * glfwGetJoystickButtons(int jid,int *count)

{
  ulong uVar1;
  GLFWbool GVar2;
  int iVar3;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x43e,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  uVar1 = (ulong)(uint)jid;
  if (0xf < (uint)jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x43f,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  if (count == (int *)0x0) {
    __assert_fail("count != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x440,"const unsigned char *glfwGetJoystickButtons(int, int *)");
  }
  *count = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    GVar2 = initJoysticks();
    if (((GVar2 != 0) && (_glfw.joysticks[uVar1].connected != 0)) &&
       (GVar2 = (*_glfw.platform.pollJoystick)((_GLFWjoystick *)(uVar1 * 0x2018 + 0x1993b8),2),
       GVar2 != 0)) {
      iVar3 = _glfw.joysticks[uVar1].buttonCount;
      if (_glfw.hints.init.hatButtons != 0) {
        iVar3 = iVar3 + _glfw.joysticks[uVar1].hatCount * 4;
      }
      *count = iVar3;
      return _glfw.joysticks[uVar1].buttons;
    }
  }
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickButtons(int jid, int* count)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    if (!initJoysticks())
        return NULL;

    js = _glfw.joysticks + jid;
    if (!js->connected)
        return NULL;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_BUTTONS))
        return NULL;

    if (_glfw.hints.init.hatButtons)
        *count = js->buttonCount + js->hatCount * 4;
    else
        *count = js->buttonCount;

    return js->buttons;
}